

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event_loop.hpp
# Opt level: O2

bool __thiscall
cppurses::detail::Timer_event_loop::unregister_widget(Timer_event_loop *this,Widget *w)

{
  size_type sVar1;
  Widget *local_8;
  
  local_8 = w;
  sVar1 = std::
          _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
          ::erase(&(this->registered_widgets_)._M_t,&local_8);
  return sVar1 == 1;
}

Assistant:

bool unregister_widget(Widget& w)
    {
        return registered_widgets_.erase(&w) == 1;
    }